

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

void __thiscall
AssemblyCode::MoveRegToMemByConst::processMemoryTemps
          (MoveRegToMemByConst *this,shared_ptr<AssemblyCode::AssemblyCommand> *thisShared,
          AssemblyCommands *newAssemblyCommands,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *spilledToOffset,CTemp *beginSP)

{
  shared_ptr<AssemblyCode::AssemblyCommand> local_40;
  CTemp *local_30;
  CTemp *beginSP_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *spilledToOffset_local;
  AssemblyCommands *newAssemblyCommands_local;
  shared_ptr<AssemblyCode::AssemblyCommand> *thisShared_local;
  MoveRegToMemByConst *this_local;
  
  local_30 = beginSP;
  beginSP_local = (CTemp *)spilledToOffset;
  spilledToOffset_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        *)newAssemblyCommands;
  newAssemblyCommands_local = (AssemblyCommands *)thisShared;
  thisShared_local = (shared_ptr<AssemblyCode::AssemblyCommand> *)this;
  std::shared_ptr<AssemblyCode::AssemblyCommand>::shared_ptr(&local_40,thisShared);
  onlyRightProcessMemoryTemps(newAssemblyCommands,spilledToOffset,beginSP,&local_40,&this->source);
  std::shared_ptr<AssemblyCode::AssemblyCommand>::~shared_ptr(&local_40);
  return;
}

Assistant:

void AssemblyCode::MoveRegToMemByConst::processMemoryTemps( std::shared_ptr<AssemblyCode::AssemblyCommand> thisShared,
                                                            AssemblyCommands &newAssemblyCommands,
                                                            std::map<std::string, int> &spilledToOffset,
                                                            IRT::CTemp &beginSP ) {

    onlyRightProcessMemoryTemps(newAssemblyCommands, spilledToOffset, beginSP,
                                thisShared, source);

}